

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepcopy.cpp
# Opt level: O0

int __thiscall
ncnn::DeepCopy::forward(DeepCopy *this,Mat *bottom_blob,Mat *top_blob,Option *param_4)

{
  bool bVar1;
  int in_ECX;
  __fn *in_RSI;
  void *in_R8;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff88;
  Mat local_68;
  int local_4;
  
  this_00 = &local_68;
  Mat::clone(this_00,in_RSI,(void *)0x0,in_ECX,in_R8);
  Mat::operator=(in_stack_ffffffffffffff88,this_00);
  Mat::~Mat((Mat *)0x1b52ee);
  bVar1 = Mat::empty(this_00);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int DeepCopy::forward(const Mat& bottom_blob, Mat& top_blob, const Option& /*opt*/) const
{
    top_blob = bottom_blob.clone();
    if (top_blob.empty())
        return -100;

    return 0;
}